

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amalgamation_demo.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  uint64_t uVar2;
  uint64_t i_1;
  Roaring64Map r2;
  uint32_t i;
  Roaring r1;
  uint32_t in_stack_ffffffffffffff4c;
  Roaring64Map *in_stack_ffffffffffffff50;
  uint64_t in_stack_ffffffffffffff58;
  Roaring64Map *in_stack_ffffffffffffff60;
  ulong local_88;
  Roaring64Map *in_stack_ffffffffffffff80;
  uint local_34;
  
  roaring::Roaring::Roaring((Roaring *)in_stack_ffffffffffffff50);
  for (local_34 = 100; local_34 < 1000; local_34 = local_34 + 1) {
    roaring::Roaring::add((Roaring *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff4c);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  uVar2 = roaring::Roaring::cardinality((Roaring *)in_stack_ffffffffffffff50);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  roaring::Roaring64Map::Roaring64Map(in_stack_ffffffffffffff50);
  for (local_88 = 0xf9ccd8a1c5080064; local_88 < 0xf9ccd8a1c50803e8; local_88 = local_88 + 1) {
    roaring::Roaring64Map::add(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  poVar1 = std::operator<<((ostream *)&std::cout,"cardinality = ");
  uVar2 = roaring::Roaring64Map::cardinality(in_stack_ffffffffffffff80);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,uVar2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  roaring::Roaring64Map::~Roaring64Map((Roaring64Map *)0x1024e2);
  roaring::Roaring::~Roaring((Roaring *)poVar1);
  return 0;
}

Assistant:

int main() {
  roaring::Roaring r1;
  for (uint32_t i = 100; i < 1000; i++) {
    r1.add(i);
  }
  std::cout << "cardinality = " << r1.cardinality() << std::endl;

  roaring::Roaring64Map r2;
  for (uint64_t i = 18000000000000000100ull; i < 18000000000000001000ull; i++) {
    r2.add(i);
  }
  std::cout << "cardinality = " << r2.cardinality() << std::endl;
  return 0;
}